

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_25c77e::kamikaze::kamikaze(kamikaze *this,kamikaze *param_1)

{
  runtime_error *this_00;
  string sStack_38;
  
  if ((anonymous_namespace)::kamikaze::instances_count < 5) {
    (anonymous_namespace)::kamikaze::instances_count =
         (anonymous_namespace)::kamikaze::instances_count + 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  burst::literals::operator____u8s_abi_cxx11_(&sStack_38,anon_var_dwarf_25d5a4,0xd);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

kamikaze (kamikaze &&)
        {
            if (instances_count > 4)
            {
                throw std::runtime_error(u8"Привет!"_u8s);
            }
            ++instances_count;
        }